

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckVariablePerLine.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckVariablePerLine(Parser *this,unsigned_long max)

{
  size_t pos;
  string *psVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t pos_00;
  long lVar5;
  size_t sVar6;
  undefined8 uVar7;
  size_t sVar8;
  allocator local_241;
  Parser *local_240;
  uint local_234;
  string *local_230;
  undefined8 local_228;
  unsigned_long local_220;
  long local_218;
  string local_210;
  string local_1f0;
  string line;
  string line_temp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  string local_158;
  char localval [22];
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string typeToFind;
  string local_70;
  string local_50;
  
  this->m_TestsDone[0x1a] = true;
  __s = (char *)operator_new__(0xff);
  local_220 = max;
  snprintf(__s,0xff,"Variables per line = %ld max");
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x1a));
  operator_delete__(__s);
  local_230 = (string *)&this->m_BufferNoComment;
  local_218 = 0;
  local_228 = 0;
  local_240 = this;
  do {
    if (local_218 == 0x60) {
      return (bool)(~(byte)local_228 & 1);
    }
    std::__cxx11::string::string
              ((string *)&typeToFind,*(char **)((long)&DAT_00188d40 + local_218),
               (allocator *)&line_temp);
    std::__cxx11::string::append((char *)&typeToFind);
    while (psVar1 = local_230, pos_00 = std::__cxx11::string::find(local_230,(ulong)&typeToFind),
          pos_00 != 0xffffffffffffffff) {
      sVar8 = pos_00;
      do {
        if ((long)sVar8 < 2) goto LAB_00145e5f;
        cVar2 = *(char *)(*(long *)psVar1 + -1 + sVar8);
        sVar8 = sVar8 - 1;
      } while (cVar2 == ' ');
      if (cVar2 == '\n') {
LAB_00145e5f:
        lVar5 = GetLineNumber(this,pos_00,true);
        GetLine_abi_cxx11_(&line,this,lVar5 - 1);
        iVar4 = std::__cxx11::string::find((char *)&line,0x1554fa);
        if (iVar4 != -1) {
          std::__cxx11::string::substr((ulong)&line_temp,(ulong)&line);
          std::__cxx11::string::operator=((string *)&line,(string *)&line_temp);
          std::__cxx11::string::~string((string *)&line_temp);
        }
        iVar4 = std::__cxx11::string::find((char *)&line,0x1554fd);
        while (iVar4 != -1) {
          iVar4 = std::__cxx11::string::find((char *)&line,0x155500);
          if (iVar4 == -1) {
            std::__cxx11::string::substr((ulong)&line_temp,(ulong)&line);
            std::__cxx11::string::operator=((string *)&line,(string *)&line_temp);
            std::__cxx11::string::~string((string *)&line_temp);
            break;
          }
          std::__cxx11::string::substr((ulong)&line_temp,(ulong)&line);
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&line);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         localval,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&line_temp,&local_b0);
          std::__cxx11::string::operator=((string *)&line,(string *)localval);
          std::__cxx11::string::~string((string *)localval);
          std::__cxx11::string::~string((string *)&local_b0);
          iVar4 = std::__cxx11::string::find((char *)&line,0x1554fd);
          std::__cxx11::string::~string((string *)&line_temp);
        }
        std::__cxx11::string::string((string *)&local_1f0,"",(allocator *)&line_temp);
        this = local_240;
        bVar3 = IsBetweenChars(local_240,'(',')',pos_00,false,&local_1f0);
        if (bVar3) {
LAB_00146077:
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        else {
          std::__cxx11::string::string((string *)&local_158,"",(allocator *)localval);
          bVar3 = IsBetweenCharsFast(this,'(',')',pos_00,false,&local_158);
          if (bVar3) {
LAB_0014606a:
            std::__cxx11::string::~string((string *)&local_158);
            goto LAB_00146077;
          }
          std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_b0);
          bVar3 = IsBetweenChars(this,'<','>',pos_00,false,&local_d0);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_d0);
            goto LAB_0014606a;
          }
          std::__cxx11::string::string((string *)&local_50,"",&local_241);
          bVar3 = IsBetweenCharsFast(this,'<','>',pos_00,false,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_1f0);
          this = local_240;
          if (!bVar3) {
            local_234 = 1;
LAB_00146109:
            sVar8 = std::__cxx11::string::find((char)&line,0x2c);
            this = local_240;
            if (sVar8 != 0xffffffffffffffff) {
              pos_00 = std::__cxx11::string::find((char)local_230,0x2c);
              std::__cxx11::string::string((string *)&local_210,"",(allocator *)&line_temp);
              bVar3 = IsBetweenChars(local_240,'(',')',pos_00,false,&local_210);
              if (!bVar3) {
                std::__cxx11::string::string((string *)&local_178,"",(allocator *)localval);
                bVar3 = IsBetweenCharsFast(local_240,'(',')',pos_00,false,&local_178);
                if (!bVar3) {
                  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_b0);
                  bVar3 = IsBetweenChars(local_240,'<','>',pos_00,false,&local_f0);
                  if (!bVar3) {
                    std::__cxx11::string::string((string *)&local_70,"",&local_241);
                    bVar3 = IsBetweenCharsFast(local_240,'<','>',pos_00,false,&local_70);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_f0);
                    std::__cxx11::string::~string((string *)&local_178);
                    std::__cxx11::string::~string((string *)&local_210);
                    sVar6 = sVar8;
                    if (!bVar3) {
                      do {
                        if ((long)sVar6 < 2) {
                          bVar3 = false;
                          goto LAB_001462ef;
                        }
                        pos = sVar6 - 1;
                        lVar5 = sVar6 - 1;
                        sVar6 = pos;
                      } while (line._M_dataplus._M_p[lVar5] != '{');
                      std::__cxx11::string::string((string *)&local_110,(string *)&line);
                      sVar6 = FindClosingChar(local_240,'{','}',pos,false,&local_110);
                      std::__cxx11::string::~string((string *)&local_110);
                      bVar3 = (long)sVar8 < (long)sVar6 || sVar6 == 0xffffffffffffffff;
LAB_001462ef:
                      do {
                        sVar8 = sVar8 + 1;
                        if (((long)(int)line._M_string_length <= (long)sVar8) ||
                           (0x20 < (ulong)(byte)line._M_dataplus._M_p[sVar8])) break;
                      } while ((0x100002600U >> ((ulong)(byte)line._M_dataplus._M_p[sVar8] & 0x3f) &
                               1) != 0);
                      if (!bVar3) {
                        local_234 = local_234 + ((long)sVar8 < (long)(int)line._M_string_length);
                      }
                    }
                    goto LAB_00146109;
                  }
                  std::__cxx11::string::~string((string *)&local_f0);
                }
                std::__cxx11::string::~string((string *)&local_178);
              }
              std::__cxx11::string::~string((string *)&local_210);
              goto LAB_00146109;
            }
            if (local_220 < local_234) {
              localval[0] = '\0';
              localval[1] = '\0';
              localval[2] = '\0';
              localval[3] = '\0';
              localval[4] = '\0';
              localval[5] = '\0';
              localval[6] = '\0';
              localval[7] = '\0';
              localval[8] = '\0';
              localval[9] = '\0';
              localval[10] = '\0';
              localval[0xb] = '\0';
              localval[0xc] = '\0';
              localval[0xd] = '\0';
              localval[0xe] = '\0';
              localval[0xf] = '\0';
              localval[0x10] = '\0';
              localval[0x11] = '\0';
              localval[0x12] = '\0';
              localval[0x13] = '\0';
              localval[0x14] = '\0';
              localval[0x15] = '\0';
              line_temp.field_2._8_8_ = &local_188;
              local_188._M_local_buf[0] = '\0';
              psVar1 = (string *)(line_temp.field_2._M_local_buf + 8);
              line_temp._M_dataplus._M_p = (pointer)GetLineNumber(local_240,pos_00,true);
              line_temp.field_2._M_allocated_capacity = 0x1a;
              line_temp._M_string_length = (size_type)line_temp._M_dataplus._M_p;
              std::__cxx11::string::assign((char *)psVar1);
              snprintf(localval,0x16,"%d",(ulong)local_234);
              std::__cxx11::string::append((char *)psVar1);
              std::__cxx11::string::append((char *)psVar1);
              localval._0_8_ = localval._0_8_ & 0xffffffffffffff00;
              snprintf(localval,0x16,"%ld",local_220);
              std::__cxx11::string::append((char *)psVar1);
              std::__cxx11::string::append((char *)psVar1);
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,(value_type *)&line_temp);
              uVar7 = std::__cxx11::string::~string(psVar1);
              local_228 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            }
          }
        }
        std::__cxx11::string::~string((string *)&line);
      }
    }
    std::__cxx11::string::~string((string *)&typeToFind);
    local_218 = local_218 + 8;
  } while( true );
}

Assistant:

bool Parser::CheckVariablePerLine(unsigned long max)
{
  m_TestsDone[VARIABLEPERLINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Variables per line = %ld max",max);
  m_TestsDescription[VARIABLEPERLINE] = val;
  delete [] val;

  // For the moment only standard types are defined.
  // We might be able to do more with finding typedefs
  #define ntypes 12
  const char* types[ntypes] = {"int","unsigned int",
   "char","unsigned char",
   "short","unsigned short",
   "long","unsigned long",
   "float","double","void","long int"};

  bool hasError = false;
  for (auto &type : types) {
    std::string typeToFind = type;
    typeToFind += " ";
    size_t posType = m_BufferNoComment.find(typeToFind,0);
    while(posType != std::string::npos)
      {
      // Check that this is the first word
      bool firstWord = false;
      auto pos = static_cast<long int>(posType);
      pos--;
      while((pos>0) && (m_BufferNoComment[pos]==' '))
        {
        pos--;
        }
      if((pos<=0) || (m_BufferNoComment[pos]=='\n'))
        {
        firstWord = true;
        }

      if(firstWord)
        {
        std::string line = this->GetLine(this->GetLineNumber(posType,true)-1);

        // Check if we have any comments
        int poscom = static_cast<int>(line.find("//",0));
        if(poscom != -1)
          {
          line = line.substr(0,poscom);
          }
        poscom = static_cast<int>(line.find("/*",0));
        while(poscom != -1)
          {
          int poscomend = static_cast<int>(line.find("*/",0));
          if(poscomend == -1)
            {
            line = line.substr(0,poscom);
            break;
            }

          std::string line_temp = line.substr(0,poscom);
          line = line_temp+line.substr(poscomend+2,line.size()-poscomend-2);
          poscom = static_cast<int>(line.find("/*",poscom+1));
          }

        // If we have any '(' in the line we stop
        if( !this->IsBetweenChars( '(', ')', posType, false ) &&
          !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
          !this->IsBetweenChars( '<', '>', posType, false ) &&
          !this->IsBetweenCharsFast( '<', '>', posType, false ))
          {
          // This is a very simple check we count the number of comas
          unsigned int vars = 1;
          pos = static_cast<long int>(line.find(',',0));
          while(pos!=-1)
            {
            posType = m_BufferNoComment.find(',', posType+1);
            if( !this->IsBetweenChars( '(', ')', posType, false ) &&
              !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
              !this->IsBetweenChars( '<', '>', posType, false ) &&
              !this->IsBetweenCharsFast( '<', '>', posType, false ))
              {
              // Check that we are not initializing an array
              bool betweenBraces = false;
              long int openCurly = pos-1;
              while(openCurly>0)
                {
                // Ok we have the opening
                if(line[openCurly] == '{')
                  {
                  long int posClosing = static_cast<long int>(this->FindClosingChar('{','}',openCurly,false,line));
                  if(posClosing == -1
                    || pos<posClosing)
                    {
                    betweenBraces = true;
                    }
                  break;
                  }
                openCurly--;
                }
              // Check if we are not at the end of the line
              bool endofline = true;
              long eof = pos+1;
              while(eof < (int)line.size())
                {
                if(line[eof] != ' ' && line[eof] != '\n'
                   && line[eof] != '\r' && line[eof] != '\t')
                  {
                  endofline = false;
                  break;
                  }
                eof++;
                }

              if(!betweenBraces && !endofline)
                {
                vars++;
                }
              }
            pos = static_cast<long int>(line.find(',',pos+1));
            }

          if(vars > max)
            {
            // len(str(2**64)) == 20 + 1 for +/- + 1  for '\0'
            char localval[22]={0}; //Make an extra large buffer to avoid compiler overflow warnings
            Error error;
            error.line = this->GetLineNumber(posType,true);
            error.line2 = error.line;
            error.number = VARIABLEPERLINE;
            error.description = "Number of variable per line exceed: ";
            snprintf(localval,sizeof(localval),"%d",vars);
            error.description += localval;
            error.description += " (max=";
            localval[0]='\0';
            snprintf(localval,sizeof(localval),"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }// end firstWord
      posType = m_BufferNoComment.find(typeToFind,posType+1);
      }
  }

  return !hasError;
}